

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O2

void duckdb_je_background_thread_postfork_parent(tsdn_t *tsdn)

{
  uint uVar1;
  
  for (uVar1 = 0; uVar1 < duckdb_je_max_background_threads; uVar1 = uVar1 + 1) {
    duckdb_je_malloc_mutex_postfork_parent(tsdn,&duckdb_je_background_thread_info[uVar1].mtx);
  }
  duckdb_je_malloc_mutex_postfork_parent(tsdn,&duckdb_je_background_thread_lock);
  return;
}

Assistant:

void
background_thread_postfork_parent(tsdn_t *tsdn) {
	for (unsigned i = 0; i < max_background_threads; i++) {
		malloc_mutex_postfork_parent(tsdn,
		    &background_thread_info[i].mtx);
	}
	malloc_mutex_postfork_parent(tsdn, &background_thread_lock);
}